

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook.cc
# Opt level: O2

_func_void_void_ptr_unsigned_long * __thiscall
base::internal::HookList<void_(*)(const_void_*,_unsigned_long)>::ExchangeSingular
          (HookList<void_(*)(const_void_*,_unsigned_long)> *this,
          _func_void_void_ptr_unsigned_long *value)

{
  _func_void_void_ptr_unsigned_long *p_Var1;
  SpinLockHolder local_28;
  SpinLockHolder l;
  
  local_28.lock_ = (SpinLock *)&hooklist_spinlock;
  SpinLock::Lock((SpinLock *)&hooklist_spinlock);
  p_Var1 = this->priv_data[7];
  this->priv_data[7] = value;
  if (value == (_func_void_void_ptr_unsigned_long *)0x0) {
    FixupPrivEndLocked(this);
  }
  else {
    (this->priv_end).super___atomic_base<unsigned_long>._M_i = 8;
  }
  SpinLockHolder::~SpinLockHolder(&local_28);
  return p_Var1;
}

Assistant:

T HookList<T>::ExchangeSingular(T value) {
  T old_value;
  SpinLockHolder l(&hooklist_spinlock);
  old_value = cast_priv_data(kHookListSingularIdx)->load(std::memory_order_relaxed);
  cast_priv_data(kHookListSingularIdx)->store(value, std::memory_order_relaxed);
  if (value != T{}) {
    priv_end.store(kHookListSingularIdx + 1, std::memory_order_relaxed);
  } else {
    FixupPrivEndLocked();
  }
  return old_value;
}